

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

int kvtree_log(kvtree *hash,int log_level,int indent)

{
  kvtree_elem *local_428;
  kvtree_elem *elem;
  undefined1 local_418 [4];
  int i;
  char tmp [1024];
  int indent_local;
  int log_level_local;
  kvtree *hash_local;
  
  tmp._1016_4_ = indent;
  tmp._1020_4_ = log_level;
  for (elem._4_4_ = 0; elem._4_4_ < (int)tmp._1016_4_; elem._4_4_ = elem._4_4_ + 1) {
    local_418[elem._4_4_] = 0x20;
  }
  local_418[(int)tmp._1016_4_] = 0;
  if (hash == (kvtree *)0x0) {
    kvtree_dbg(tmp._1020_4_,"%sNULL LIST\n",local_418);
  }
  else {
    for (local_428 = hash->lh_first; local_428 != (kvtree_elem *)0x0;
        local_428 = (local_428->pointers).le_next) {
      kvtree_elem_log(local_428,tmp._1020_4_,tmp._1016_4_ + 2);
    }
  }
  return 0;
}

Assistant:

int kvtree_log(const kvtree* hash, int log_level, int indent)
{
  char tmp[KVTREE_MAX_FILENAME];
  int i;
  for (i = 0; i < indent; i++) {
    tmp[i] = ' ';
  }
  tmp[indent] = '\0';

  if (hash != NULL) {
    kvtree_elem* elem;
    LIST_FOREACH(elem, hash, pointers) {
      kvtree_elem_log(elem, log_level, indent+2);
    }
  } else {
    kvtree_dbg(log_level, "%sNULL LIST\n", tmp);
  }
  return KVTREE_SUCCESS;
}